

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

int INT_CMfork_comm_thread(CManager_conflict cm)

{
  int iVar1;
  __pid_t _Var2;
  long lVar3;
  pthread_t pVar4;
  long in_RDI;
  timespec ts_3;
  timespec ts_2;
  pthread_t test_thread;
  timespec ts_1;
  timespec ts;
  pthread_t server_thread;
  void *in_stack_ffffffffffffff60;
  FILE *pFVar5;
  _func_void_ptr_void_ptr *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff98;
  CMTraceType trace_type;
  CManager in_stack_ffffffffffffffa0;
  long local_58;
  timespec local_50;
  pthread_t local_40;
  timespec local_38;
  timespec local_28;
  pthread_t local_18;
  long local_10;
  
  trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_10 = in_RDI;
  if (*(int *)(*(long *)(in_RDI + 0x20) + 0x50) == 0) {
    CM_init_select((CMControlList)server_thread,(CManager_conflict)ts.tv_nsec);
  }
  if (*(int *)(*(long *)(local_10 + 0x20) + 0xe8) == 0) {
    if (**(long **)(local_10 + 0x20) == 0) {
      local_40 = thr_fork(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      if (local_40 == 0) {
        iVar1 = CMtrace_val[3];
        if (*(long *)(local_10 + 0x120) == 0) {
          iVar1 = CMtrace_init(in_stack_ffffffffffffffa0,trace_type);
        }
        if (iVar1 != 0) {
          if (CMtrace_PID != 0) {
            pFVar5 = *(FILE **)(local_10 + 0x120);
            _Var2 = getpid();
            pVar4 = pthread_self();
            fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar4);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_50);
            fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",local_50.tv_sec,local_50.tv_nsec);
          }
          fprintf(*(FILE **)(local_10 + 0x120),"CM - Test fork failed, no comm thread\n");
        }
        fflush(*(FILE **)(local_10 + 0x120));
        return 0;
      }
      iVar1 = CMtrace_val[3];
      if (*(long *)(local_10 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffffa0,trace_type);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar5 = *(FILE **)(local_10 + 0x120);
          _Var2 = getpid();
          lVar3 = (long)_Var2;
          pVar4 = pthread_self();
          fprintf(pFVar5,"P%lxT%lx - ",lVar3,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&stack0xffffffffffffffa0);
          fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffffa0,local_58);
        }
        fprintf(*(FILE **)(local_10 + 0x120),"CM - Will fork comm thread later\n");
      }
      fflush(*(FILE **)(local_10 + 0x120));
      *(undefined4 *)(*(long *)(local_10 + 0x20) + 0xe8) = 0xffffffff;
    }
    else {
      local_18 = thr_fork(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      iVar1 = CMtrace_val[3];
      if (*(long *)(local_10 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffffa0,trace_type);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar5 = *(FILE **)(local_10 + 0x120);
          _Var2 = getpid();
          lVar3 = (long)_Var2;
          pVar4 = pthread_self();
          fprintf(pFVar5,"P%lxT%lx - ",lVar3,pVar4);
          trace_type = (CMTraceType)((ulong)lVar3 >> 0x20);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_28);
          fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",local_28.tv_sec,local_28.tv_nsec);
        }
        fprintf(*(FILE **)(local_10 + 0x120),"CM - Forked comm thread %p\n",local_18);
      }
      fflush(*(FILE **)(local_10 + 0x120));
      if (local_18 == 0) {
        return 0;
      }
      *(pthread_t *)(*(long *)(local_10 + 0x20) + 0xf0) = local_18;
      *(undefined4 *)(*(long *)(local_10 + 0x20) + 0xe8) = 1;
      *(int *)(local_10 + 0xc) = *(int *)(local_10 + 0xc) + 1;
      iVar1 = CMtrace_val[7];
      if (*(long *)(local_10 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffffa0,trace_type);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar5 = *(FILE **)(local_10 + 0x120);
          _Var2 = getpid();
          pVar4 = pthread_self();
          fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_38);
          fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
        }
        fprintf(*(FILE **)(local_10 + 0x120),"Forked - CManager %p ref count now %d\n",local_10,
                (ulong)*(uint *)(local_10 + 0xc));
      }
      fflush(*(FILE **)(local_10 + 0x120));
      *(int *)(*(long *)(local_10 + 0x20) + 0xa0) = *(int *)(*(long *)(local_10 + 0x20) + 0xa0) + 1;
      *(int *)(*(long *)(local_10 + 0x20) + 0xa4) = *(int *)(*(long *)(local_10 + 0x20) + 0xa4) + 1;
    }
  }
  return 1;
}

Assistant:

int
INT_CMfork_comm_thread(CManager cm)
{
    /* if we're on a kernel-level-threads package, for the thread and 
       return 1, else return 0; */
    if (!cm->control_list->select_initialized) {
	CM_init_select(cm->control_list, cm);
    }
    if (cm->control_list->has_thread == 0) {
	if (cm->control_list->network_blocking_function.func) {
	    thr_thread_t server_thread = 
		thr_fork((void*(*)(void*))server_thread_func, 
			 (void*)cm);
	    CMtrace_out(cm, CMLowLevelVerbose,
			"CM - Forked comm thread %p\n", (void*)(intptr_t)server_thread);
	    if (server_thread ==  (thr_thread_t)(intptr_t) NULL) {
		return 0;
	    }
	    cm->control_list->server_thread = thr_get_thread_id(server_thread);
	    cm->control_list->has_thread = 1;
	    cm->reference_count++;
	    CMtrace_out(cm, CMFreeVerbose, "Forked - CManager %p ref count now %d\n", 
			cm, cm->reference_count);
	    cm->control_list->cl_reference_count++;
	    cm->control_list->free_reference_count++;
	} else {
	    /*
	     *  Can't start a server thread yet, but lets see 
	     *  if we can fork anything successfully.
	     */
	    thr_thread_t test_thread = 
		thr_fork((void*(*)(void*))CM_test_thread_func, 
			 (void*)cm);
	    if (test_thread ==  (thr_thread_t)(intptr_t) NULL) {
		/* No.  Say we can't. */
		CMtrace_out(cm, CMLowLevelVerbose,
			    "CM - Test fork failed, no comm thread\n");
		return 0;
	    }
	    /* OK, we'll fork it later. */
	    CMtrace_out(cm, CMLowLevelVerbose,
			"CM - Will fork comm thread later\n");
	    cm->control_list->has_thread = -1; /* should fork one */
	}
    }
    return 1;
}